

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::text::text(text *this)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  base_text *in_stack_ffffffffffffffd0;
  string local_28 [24];
  base_widget *in_stack_fffffffffffffff0;
  
  base_widget::base_widget(in_stack_fffffffffffffff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"text",(allocator *)&stack0xffffffffffffffd7);
  base_html_input::base_html_input
            ((base_html_input *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  base_text::base_text(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = 0x52c520;
  in_RDI[0x11] = 0x52c5d8;
  in_RDI[6] = 0x52c560;
  *(undefined4 *)(in_RDI + 0xf) = 0xffffffff;
  booster::hold_ptr<cppcms::widgets::text::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::text::_data> *)(in_RDI + 0x10));
  return;
}

Assistant:

text::text(): base_html_input("text"), size_(-1) {}